

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> * __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator::next
          (FastInstancesIterator *this)

{
  bool bVar1;
  LiteralClause *this_00;
  InstMatcher *in_RSI;
  Renaming *in_RDI;
  Renaming normalizer;
  bool ground;
  LiteralClause *ld;
  Renaming *in_stack_ffffffffffffff50;
  SmartPtr<Indexing::ResultSubstitution> *this_01;
  SmartPtr<Indexing::ResultSubstitution> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar2;
  Renaming *this_02;
  SmartPtr<Indexing::ResultSubstitution> local_80;
  SmartPtr<Indexing::ResultSubstitution> local_70 [2];
  SmartPtr<Indexing::ResultSubstitution> local_50;
  FastInstancesIterator *in_stack_ffffffffffffffc8;
  
  this_02 = in_RDI;
  do {
    bVar1 = Lib::VirtualIterator<Indexing::LiteralClause_*>::hasNext
                      ((VirtualIterator<Indexing::LiteralClause_*> *)0x33b15f);
    uVar2 = false;
    if (!bVar1) {
      uVar2 = findNextLeaf(in_stack_ffffffffffffffc8);
    }
  } while ((bool)uVar2 != false);
  this_00 = Lib::VirtualIterator<Indexing::LiteralClause_*>::next
                      ((VirtualIterator<Indexing::LiteralClause_*> *)0x33b194);
  if (((in_RSI->_boundVars)._capacity & 1) == 0) {
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(&local_80);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>::QueryRes
              ((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> *)
               CONCAT17(uVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58,
               (LiteralClause *)in_stack_ffffffffffffff50);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_ffffffffffffff50);
  }
  else {
    Kernel::Renaming::reset(in_stack_ffffffffffffff50);
    LiteralClause::key(this_00);
    bVar1 = SubstitutionTree<Indexing::LiteralClause>::isGround((Literal *)0x33b1d3);
    if (!bVar1) {
      in_stack_ffffffffffffff58 = &local_50;
      Kernel::Renaming::Renaming(in_stack_ffffffffffffff50);
      LiteralClause::key(this_00);
      Kernel::Renaming::normalizeVariables
                ((Renaming *)CONCAT17(uVar2,in_stack_ffffffffffffff60),
                 (Literal *)in_stack_ffffffffffffff58);
      Kernel::Renaming::makeInverse(this_02,in_RDI);
      Kernel::Renaming::~Renaming((Renaming *)0x33b230);
    }
    this_01 = local_70;
    SubstitutionTree<Indexing::LiteralClause>::InstMatcher::getSubstitution(in_RSI,this_02);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>::QueryRes
              ((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> *)
               CONCAT17(uVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58,
               (LiteralClause *)this_01);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(this_01);
  }
  return (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> *)this_02;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastInstancesIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultDenormalizer.reset();
    bool ground = SubstitutionTree::isGround(ld->key());
    if(!ground) {
      Renaming normalizer;
      normalizer.normalizeVariables(ld->key());
      _resultDenormalizer.makeInverse(normalizer);
    }

    return QueryRes(_subst.getSubstitution(&_resultDenormalizer), ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}